

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cut.cpp
# Opt level: O2

int dfs_dinic(int v,int t,int flow)

{
  int *piVar1;
  uint uVar2;
  int v_00;
  long lVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  
  iVar5 = 0;
  if ((flow != 0) && (iVar5 = flow, v != t)) {
    lVar7 = (long)v;
    iVar5 = *(int *)((anonymous_namespace)::ptr + lVar7 * 4);
    lVar3 = (anonymous_namespace)::ptr;
    lVar4 = (anonymous_namespace)::edges_dup;
    while (lVar6 = *(long *)(lVar4 + lVar7 * 0x18),
          iVar5 < (int)((ulong)(*(long *)(lVar4 + 8 + lVar7 * 0x18) - lVar6) >> 2)) {
      uVar2 = *(uint *)(lVar6 + (long)iVar5 * 4);
      lVar6 = (long)(int)uVar2 * 0x10;
      v_00 = *(int *)((anonymous_namespace)::edgelist + 4 + lVar6);
      if (*(int *)((anonymous_namespace)::dis + (long)v_00 * 4) ==
          *(int *)((anonymous_namespace)::dis + lVar7 * 4) + 1) {
        iVar5 = *(int *)((anonymous_namespace)::edgelist + lVar6 + 8) -
                *(int *)((anonymous_namespace)::edgelist + lVar6 + 0xc);
        if (flow <= iVar5) {
          iVar5 = flow;
        }
        iVar5 = dfs_dinic(v_00,t,iVar5);
        lVar3 = (anonymous_namespace)::edgelist;
        if (iVar5 != 0) {
          piVar1 = (int *)((anonymous_namespace)::edgelist + 0xc + lVar6);
          *piVar1 = *piVar1 + iVar5;
          piVar1 = (int *)(lVar3 + 0xc + (long)(int)(uVar2 ^ 1) * 0x10);
          *piVar1 = *piVar1 - iVar5;
          return iVar5;
        }
        iVar5 = *(int *)((anonymous_namespace)::ptr + lVar7 * 4);
        lVar3 = (anonymous_namespace)::ptr;
        lVar4 = (anonymous_namespace)::edges_dup;
      }
      iVar5 = iVar5 + 1;
      *(int *)(lVar3 + lVar7 * 4) = iVar5;
    }
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int dfs_dinic(int v, int t, int flow) {
    if (!flow) {
        return 0;
    }
    
    if (v == t) {
        return flow;
    }
    
    for (; ptr[v] < (int) edges_dup[v].size(); ptr[v]++) {
        int ind = edges_dup[v][ptr[v]];
        int next = edgelist[ind].b;
        
        if (dis[next] != dis[v] + 1) {
            continue;
        }
        
        int pushed = dfs_dinic(next, t, min(flow, edgelist[ind].c - edgelist[ind].flow));
        
        if (pushed) {
            edgelist[ind].flow += pushed;
            edgelist[ind ^ 1].flow -= pushed;
            return pushed;
        }
    }
    
    return 0;
}